

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QAbstractAnimationPrivate::setState(QAbstractAnimationPrivate *this,State newState)

{
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *this_00;
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  *this_01;
  State _t2;
  int iVar1;
  QObject *this_02;
  bool bVar2;
  parameter_type pVar3;
  parameter_type pVar4;
  parameter_type pVar5;
  parameter_type pVar6;
  parameter_type pVar7;
  int iVar8;
  parameter_type pVar9;
  State SVar10;
  parameter_type pVar11;
  QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
  *this_03;
  long in_FS_OFFSET;
  bool isTopLevel;
  QWeakPointer<QObject> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _t2 = (this->state).super_QPropertyData<QAbstractAnimation::State>.val;
  if (_t2 == newState) goto LAB_003607da;
  this_02 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  this_03 = &this->loopCount;
  pVar3 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
          ::value(this_03);
  if (pVar3 == 0) goto LAB_003607da;
  iVar1 = this->currentTime;
  pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(&this->currentLoop);
  pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(&this->direction);
  if (_t2 == Stopped && newState - Paused < 2) {
    this_01 = &this->totalCurrentTime;
    pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
            ::value(this_01);
    pVar7 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
            ::value(&this->direction);
    if (pVar7 == Forward) {
      iVar8 = 0;
    }
    else {
      pVar3 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
              ::value(this_03);
      if (pVar3 == -1) {
        iVar8 = (*this_02->_vptr_QObject[0xc])(this_02);
      }
      else {
        iVar8 = QAbstractAnimation::totalDuration((QAbstractAnimation *)this_02);
      }
    }
    this->currentTime = iVar8;
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
    ::setValue(this_01,iVar8);
    pVar9 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
            ::value(this_01);
    if (pVar9 != pVar6) {
      QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
      ::notify(this_01);
    }
  }
  (this->state).super_QPropertyData<QAbstractAnimation::State>.val = newState;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QAbstractAnimation>::QPointer<void>
            ((QPointer<QAbstractAnimation> *)&local_48,(QAbstractAnimation *)this_02);
  if ((QAbstractAnimation *)this->group == (QAbstractAnimation *)0x0) {
    isTopLevel = true;
  }
  else {
    SVar10 = QAbstractAnimation::state((QAbstractAnimation *)this->group);
    isTopLevel = SVar10 == Stopped;
  }
  if (_t2 == Running) {
    if ((newState == Paused) && (this->hasRegisteredTimer == true)) {
      QAnimationTimer::ensureTimerUpdate();
    }
    QAnimationTimer::unregisterAnimation((QAbstractAnimation *)this_02);
  }
  else if (newState == Running) {
    QAnimationTimer::registerAnimation((QAbstractAnimation *)this_02,isTopLevel);
  }
  (*this_02->_vptr_QObject[0xe])(this_02,(ulong)newState,(ulong)_t2);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
  if ((bVar2) &&
     (this_00 = &this->state,
     (this_00->super_QPropertyData<QAbstractAnimation::State>).val == newState)) {
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::notify(this_00);
    QAbstractAnimation::stateChanged((QAbstractAnimation *)this_02,newState,_t2);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
    if ((bVar2) && ((this_00->super_QPropertyData<QAbstractAnimation::State>).val == newState)) {
      pVar11 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
               ::value(this_00);
      if (pVar11 == Stopped) {
        iVar8 = (*this_02->_vptr_QObject[0xc])(this_02);
        if (this->deleteWhenStopped == true) {
          QObject::deleteLater(this_02);
        }
        if ((iVar8 == -1) ||
           (pVar3 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                    ::value(this_03), pVar3 < 0)) {
LAB_003607c8:
          QAbstractAnimation::finished((QAbstractAnimation *)this_02);
        }
        else if (pVar5 == Forward) {
          pVar3 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                  ::value(this_03);
          if ((pVar4 + 1) * iVar1 == pVar3 * iVar8) goto LAB_003607c8;
        }
        else if (pVar5 == Backward && iVar1 == 0) goto LAB_003607c8;
      }
      else if ((pVar11 == Running) && (isTopLevel == true && _t2 == Stopped)) {
        QAnimationTimer::ensureTimerUpdate();
        pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                ::value(&this->totalCurrentTime);
        QAbstractAnimation::setCurrentTime((QAbstractAnimation *)this_02,pVar6);
      }
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
LAB_003607da:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractAnimationPrivate::setState(QAbstractAnimation::State newState)
{
    Q_Q(QAbstractAnimation);
    const QAbstractAnimation::State oldState = state.valueBypassingBindings();
    if (oldState == newState)
        return;

    if (loopCount == 0)
        return;

    int oldCurrentTime = currentTime;
    int oldCurrentLoop = currentLoop;
    QAbstractAnimation::Direction oldDirection = direction;

    // check if we should Rewind
    if ((newState == QAbstractAnimation::Paused || newState == QAbstractAnimation::Running)
        && oldState == QAbstractAnimation::Stopped) {
            const int oldTotalCurrentTime = totalCurrentTime;
            //here we reset the time if needed
            //we don't call setCurrentTime because this might change the way the animation
            //behaves: changing the state or changing the current value
            totalCurrentTime = currentTime = (direction == QAbstractAnimation::Forward) ?
                0 : (loopCount == -1 ? q->duration() : q->totalDuration());
            if (totalCurrentTime != oldTotalCurrentTime)
                totalCurrentTime.notify();
    }

    state.setValueBypassingBindings(newState);
    QPointer<QAbstractAnimation> guard(q);

    //(un)registration of the animation must always happen before calls to
    //virtual function (updateState) to ensure a correct state of the timer
    bool isTopLevel = !group || group->state() == QAbstractAnimation::Stopped;
    if (oldState == QAbstractAnimation::Running) {
        if (newState == QAbstractAnimation::Paused && hasRegisteredTimer)
            QAnimationTimer::ensureTimerUpdate();
        //the animation, is not running any more
        QAnimationTimer::unregisterAnimation(q);
    } else if (newState == QAbstractAnimation::Running) {
        QAnimationTimer::registerAnimation(q, isTopLevel);
    }

    q->updateState(newState, oldState);
    //this is to be safe if updateState changes the state
    if (!guard || newState != state.valueBypassingBindings())
        return;

    // Notify state change
    state.notify();
    emit q->stateChanged(newState, oldState);
    //this is to be safe if updateState changes the state
    if (!guard || newState != state.valueBypassingBindings())
        return;

    switch (state) {
    case QAbstractAnimation::Paused:
        break;
    case QAbstractAnimation::Running:
        {

            // this ensures that the value is updated now that the animation is running
            if (oldState == QAbstractAnimation::Stopped) {
                if (isTopLevel) {
                    // currentTime needs to be updated if pauseTimer is active
                    QAnimationTimer::ensureTimerUpdate();
                    q->setCurrentTime(totalCurrentTime);
                }
            }
        }
        break;
    case QAbstractAnimation::Stopped:
        // Leave running state.
        int dura = q->duration();

        if (deleteWhenStopped)
            q->deleteLater();

        if (dura == -1 || loopCount < 0
            || (oldDirection == QAbstractAnimation::Forward && (oldCurrentTime * (oldCurrentLoop + 1)) == (dura * loopCount))
            || (oldDirection == QAbstractAnimation::Backward && oldCurrentTime == 0)) {
                emit q->finished();
        }
        break;
    }
}